

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

bool units::cleanUnitString(string *unit_string,uint64_t match_flags)

{
  byte *pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte *pbVar3;
  pointer pcVar4;
  _Alloc_hider __nptr;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  size_t sVar11;
  undefined8 uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  uint *puVar16;
  const_iterator cVar17;
  size_t sVar18;
  pointer pcVar19;
  char cVar20;
  size_type sVar21;
  char cVar22;
  char *pcVar23;
  byte *pbVar24;
  char *pcVar25;
  size_t sz;
  byte bVar26;
  string *psVar27;
  string *unit_string_00;
  string *psVar28;
  char cVar29;
  long lVar30;
  char cVar31;
  byte *pbVar32;
  size_t *in_R9;
  long lVar33;
  pointer pcVar34;
  byte bVar35;
  byte bVar36;
  undefined8 unaff_R14;
  ulong uVar37;
  size_type sVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  double dVar43;
  precise_unit pVar44;
  precise_unit pVar45;
  size_t reploc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  uint local_5a0;
  ulong local_598;
  undefined1 local_58a;
  undefined1 local_589;
  string *local_588;
  undefined4 local_57c;
  size_type local_578;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_570 [4];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_470;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_430;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_370;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_330;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  local_578 = unit_string->_M_string_length;
  unit_string_00 = unit_string;
  if ((cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_ == '\0') &&
     (iVar7 = __cxa_guard_acquire(&cleanUnitString(std::__cxx11::string&,unsigned_long)::
                                   spchar_abi_cxx11_), iVar7 != 0)) {
    paVar2 = &local_570[0].first.field_2;
    local_570[0].first._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_570," \t\n\r","");
    std::operator+(&cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_,
                   &local_570[0].first,'\0');
    unit_string = unit_string_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570[0].first._M_dataplus._M_p != paVar2) {
      operator_delete(local_570[0].first._M_dataplus._M_p,
                      local_570[0].first.field_2._M_allocated_capacity + 1);
      unit_string = unit_string_00;
    }
    __cxa_atexit(std::__cxx11::string::~string,
                 &cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_);
    unit_string_00 = unit_string;
  }
  bVar26 = 0;
  uVar6 = (byte)(unit_string->_M_dataplus)._M_p[unit_string->_M_string_length - 1] - 0x2a;
  if ((uVar6 < 0x35) && ((0x10000000000021U >> ((ulong)uVar6 & 0x3f) & 1) != 0)) {
    std::__cxx11::string::pop_back();
    bVar26 = 1;
  }
  uVar9 = std::__cxx11::string::find_first_not_of
                    ((char *)unit_string,
                     (ulong)cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_.
                            _M_dataplus._M_p,0);
  if (uVar9 != 0) {
    if (uVar9 == 0xffffffffffffffff) {
      unit_string->_M_string_length = 0;
      *(unit_string->_M_dataplus)._M_p = '\0';
      return true;
    }
    std::__cxx11::string::erase((ulong)unit_string,0);
    uVar9 = std::__cxx11::string::find_first_not_of
                      ((char *)unit_string,
                       (ulong)cleanUnitString(std::__cxx11::string&,unsigned_long)::
                              spchar_abi_cxx11_._M_dataplus._M_p,0);
    bVar26 = 1;
  }
  bVar39 = (unit_string->_M_dataplus)._M_p[uVar9] == '/';
  if (bVar39) {
    std::__cxx11::string::insert((ulong)unit_string,uVar9,'\x01');
    bVar26 = 1;
  }
  if ((match_flags >> 0x24 & 1) == 0) {
    pcVar10 = (unit_string->_M_dataplus)._M_p;
    uVar9 = unit_string->_M_string_length;
    pcVar25 = pcVar10 + uVar9;
    local_57c = (undefined4)CONCAT71((int7)((ulong)unaff_R14 >> 8),bVar39);
    pcVar23 = pcVar10;
    if (0 < (long)uVar9 >> 2) {
      pcVar23 = pcVar10 + (uVar9 & 0xfffffffffffffffc);
      lVar30 = ((long)uVar9 >> 2) + 1;
      pcVar10 = pcVar10 + 3;
      do {
        if (pcVar10[-3] < '\0') {
          pcVar10 = pcVar10 + -3;
          goto LAB_0017a637;
        }
        if (pcVar10[-2] < '\0') {
          pcVar10 = pcVar10 + -2;
          goto LAB_0017a637;
        }
        if (pcVar10[-1] < '\0') {
          pcVar10 = pcVar10 + -1;
          goto LAB_0017a637;
        }
        if (*pcVar10 < '\0') goto LAB_0017a637;
        lVar30 = lVar30 + -1;
        pcVar10 = pcVar10 + 4;
      } while (1 < lVar30);
    }
    lVar30 = (long)pcVar25 - (long)pcVar23;
    if (lVar30 == 1) {
LAB_0017a5ff:
      pcVar10 = pcVar23;
      if (-1 < *pcVar23) {
        pcVar10 = pcVar25;
      }
LAB_0017a637:
      if (pcVar10 != pcVar25) {
        bVar35 = 0;
        lVar30 = 0;
        do {
          pcVar25 = *(char **)((long)&unicodeReplacement(std::__cxx11::string&)::ucodeReplacements +
                              lVar30);
          strlen(pcVar25);
          uVar9 = std::__cxx11::string::find((char *)unit_string_00,(ulong)pcVar25,0);
          while (uVar9 != 0xffffffffffffffff) {
            pcVar10 = (char *)strlen(pcVar25);
            if ((uVar9 == 0 || pcVar10 != (char *)0x1) ||
               ((byte)(unit_string_00->_M_dataplus)._M_p[uVar9 - 1] < 0xc1)) {
              pcVar23 = *(char **)((long)&DAT_001ccd30 + lVar30);
              strlen(pcVar23);
              psVar27 = unit_string_00;
              std::__cxx11::string::replace((ulong)unit_string_00,uVar9,pcVar10,(ulong)pcVar23);
              if (uVar9 == 0) {
                uVar9 = 0;
              }
              else if ((unit_string_00->_M_dataplus)._M_p[uVar9 - 1] == '\\') {
                uVar9 = uVar9 - 1;
                std::__cxx11::string::erase((ulong)unit_string_00,uVar9);
              }
              sVar11 = strlen(pcVar23);
              uVar9 = sVar11 + uVar9;
              bVar35 = 1;
            }
            else {
              uVar9 = uVar9 + 1;
              psVar27 = unit_string_00;
            }
            strlen(pcVar25);
            uVar9 = std::__cxx11::string::find((char *)psVar27,(ulong)pcVar25,uVar9);
            unit_string_00 = psVar27;
          }
          lVar30 = lVar30 + 0x10;
        } while (lVar30 != 0x420);
        bVar26 = bVar35 | bVar26;
      }
    }
    else {
      if (lVar30 == 2) {
LAB_0017a5f7:
        pcVar10 = pcVar23;
        if (-1 < *pcVar23) {
          pcVar23 = pcVar23 + 1;
          goto LAB_0017a5ff;
        }
        goto LAB_0017a637;
      }
      if (lVar30 == 3) {
        pcVar10 = pcVar23;
        if (-1 < *pcVar23) {
          pcVar23 = pcVar23 + 1;
          goto LAB_0017a5f7;
        }
        goto LAB_0017a637;
      }
    }
    lVar30 = 0;
    do {
      pcVar25 = *(char **)((long)&cleanUnitString::earlyCodeReplacements._M_elems[0].first + lVar30)
      ;
      strlen(pcVar25);
      uVar9 = std::__cxx11::string::find((char *)unit_string_00,(ulong)pcVar25,0);
      psVar27 = unit_string_00;
      if (uVar9 != 0xffffffffffffffff) {
        pcVar10 = *(char **)((long)&cleanUnitString::earlyCodeReplacements._M_elems[0].second +
                            lVar30);
        do {
          pcVar23 = (char *)strlen(pcVar25);
          strlen(pcVar10);
          std::__cxx11::string::replace((ulong)unit_string_00,uVar9,pcVar23,(ulong)pcVar10);
          strlen(pcVar25);
          uVar9 = std::__cxx11::string::find((char *)unit_string_00,(ulong)pcVar25,uVar9 + 1);
        } while (uVar9 != 0xffffffffffffffff);
        bVar26 = 1;
      }
      lVar30 = lVar30 + 0x10;
      unit_string_00 = psVar27;
    } while (lVar30 != 0x40);
    lVar30 = std::__cxx11::string::find_first_of
                       ((char *)psVar27,
                        (ulong)cleanUnitString(std::__cxx11::string&,unsigned_long)::
                               spchar_abi_cxx11_._M_dataplus._M_p,0);
    if (lVar30 == -1) {
      local_598 = 0xffffffffffffffff;
    }
    else {
      local_588 = (string *)0x0;
      iVar7 = std::__cxx11::string::compare((ulong)psVar27,0,(char *)0x4);
      if (iVar7 == 0) {
        local_588 = (string *)0x2;
        uVar12 = std::__cxx11::string::replace((ulong)psVar27,0,(char *)0x4,0x192071);
        local_57c = (undefined4)CONCAT71((int7)((ulong)uVar12 >> 8),1);
      }
      bVar39 = ReplaceStringInPlace(psVar27," per ",5,"/",(int)&local_588,in_R9);
      if (local_588 != (string *)0x0) {
        cVar31 = (char)psVar27;
        uVar9 = std::__cxx11::string::find(cVar31,0x28);
        if (uVar9 != 0xffffffffffffffff) {
          uVar13 = std::__cxx11::string::find(cVar31,0x2f);
          do {
            uVar37 = uVar13 + 1;
            uVar14 = std::__cxx11::string::find(cVar31,0x2f);
            uVar13 = uVar14;
            if (uVar9 < uVar14) {
              if (uVar14 == 0xffffffffffffffff) {
                std::__cxx11::string::push_back(cVar31);
              }
              else {
                std::__cxx11::string::insert((ulong)psVar27,uVar14,'\x01');
              }
              std::__cxx11::string::insert((ulong)psVar27,uVar37,'\x01');
              uVar13 = uVar14 + 2;
            }
          } while (uVar14 != 0xffffffffffffffff);
        }
      }
      lVar33 = 2;
      lVar30 = std::__cxx11::string::find_first_not_of((char *)psVar27,0x191a3b,0);
      lVar30 = std::__cxx11::string::find_first_of((char *)psVar27,0x191a3b,lVar30 + 1);
      lVar15 = std::__cxx11::string::find_first_of((char *)psVar27,0x196d63,0);
      if (lVar30 == 2) {
        if (4 < psVar27->_M_string_length) {
          lVar33 = 2;
          lVar30 = std::__cxx11::string::find_first_not_of((char *)psVar27,0x191a3b,2);
          if (((lVar30 != -1) && (lVar15 == -1)) && ((psVar27->_M_dataplus)._M_p[lVar30] != '(')) {
            lVar30 = 2;
            std::__cxx11::string::substr((ulong)local_570,(ulong)psVar27);
            iVar7 = std::__cxx11::string::compare((char *)local_570);
            if ((iVar7 != 0) &&
               (pVar44 = get_unit(&local_570[0].first,match_flags),
               pVar44.base_units_ != (unit_data)0xfa94a488 || !NAN(pVar44.multiplier_))) {
              (psVar27->_M_dataplus)._M_p[2] = '_';
              pVar44 = get_unit(psVar27,match_flags);
              if (pVar44.base_units_ == (unit_data)0xfa94a488 && NAN(pVar44.multiplier_)) {
                (psVar27->_M_dataplus)._M_p[2] = '*';
              }
              lVar30 = std::__cxx11::string::find_first_of((char *)psVar27,0x191a3b,3);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_570[0].first._M_dataplus._M_p != &local_570[0].first.field_2) {
              operator_delete(local_570[0].first._M_dataplus._M_p,
                              local_570[0].first.field_2._M_allocated_capacity + 1);
            }
            goto LAB_0017aa99;
          }
        }
LAB_0017aaa6:
        paVar2 = &local_570[0].first.field_2;
        do {
          if (lVar33 + 2U == psVar27->_M_string_length) {
            if (lVar15 == -1) {
              std::__cxx11::string::substr((ulong)local_570,(ulong)psVar27);
              pVar44 = get_unit(&local_570[0].first,match_flags);
              bVar40 = pVar44.base_units_ != (unit_data)0xfa94a488;
              psVar27 = unit_string_00;
              if (bVar40 || !NAN(pVar44.multiplier_)) {
                (unit_string_00->_M_dataplus)._M_p[lVar33] = '_';
                pVar45 = get_unit(unit_string_00,match_flags);
                psVar27 = unit_string_00;
                if (pVar45.base_units_ == (unit_data)0xfa94a488 && NAN(pVar45.multiplier_)) {
                  (unit_string_00->_M_dataplus)._M_p[lVar33] = '*';
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_570[0].first._M_dataplus._M_p != paVar2) {
                operator_delete(local_570[0].first._M_dataplus._M_p,
                                local_570[0].first.field_2._M_allocated_capacity + 1);
              }
              unit_string_00 = psVar27;
              if (bVar40 || !NAN(pVar44.multiplier_)) break;
            }
            shortStringReplacement_abi_cxx11_((char)((ulong)unit_string_00 >> 0x10));
            std::__cxx11::string::replace
                      ((ulong)psVar27,lVar33 + 1,(char *)0x1,
                       (ulong)local_570[0].first._M_dataplus._M_p);
LAB_0017abe1:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_570[0].first._M_dataplus._M_p != paVar2) {
              operator_delete(local_570[0].first._M_dataplus._M_p,
                              local_570[0].first.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            uVar6 = (byte)(psVar27->_M_dataplus)._M_p[lVar33 + 1] - 0x20;
            if ((uVar6 < 0x3f) && ((0x400000000000c401U >> ((ulong)uVar6 & 0x3f) & 1) != 0)) {
              shortStringReplacement_abi_cxx11_((char)((ulong)unit_string_00 >> 0x10));
              std::__cxx11::string::replace
                        ((ulong)psVar27,lVar33 + 1,(char *)0x1,
                         (ulong)local_570[0].first._M_dataplus._M_p);
              goto LAB_0017abe1;
            }
          }
          lVar33 = std::__cxx11::string::find_first_of((char *)psVar27,0x191a3b,lVar33 + 1);
        } while (lVar33 != -1);
      }
      else {
LAB_0017aa99:
        lVar33 = lVar30;
        if (lVar33 != -1) goto LAB_0017aaa6;
      }
      uVar9 = std::__cxx11::string::find((char *)psVar27,0x190728,0);
      local_598 = 0xffffffffffffffff;
      while (uVar13 = local_598, uVar9 != 0xffffffffffffffff) {
        lVar30 = std::__cxx11::string::find_first_not_of
                           ((char *)psVar27,
                            (ulong)cleanUnitString(std::__cxx11::string&,unsigned_long)::
                                   spchar_abi_cxx11_._M_dataplus._M_p,uVar9 + 4);
        if ((lVar30 != -1) &&
           ((cVar31 = (psVar27->_M_dataplus)._M_p[lVar30], uVar13 = uVar9, cVar31 == '(' ||
            (cVar31 == '[')))) break;
        uVar9 = std::__cxx11::string::find((char *)psVar27,0x190728,uVar9 + 3);
      }
      local_598 = uVar13;
      if ((cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_ == '\0') &&
         (iVar7 = __cxa_guard_acquire(&cleanSpaces(std::__cxx11::string&,bool)::
                                       spaceChars_abi_cxx11_), iVar7 != 0)) {
        paVar2 = &local_570[0].first.field_2;
        local_570[0].first._M_string_length = 4;
        local_570[0].first.field_2._0_5_ = 0xd0a0920;
        local_570[0].first._M_dataplus._M_p = (pointer)paVar2;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,
                       &local_570[0].first,'\0');
        psVar27 = unit_string_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_570[0].first._M_dataplus._M_p != paVar2) {
          operator_delete(local_570[0].first._M_dataplus._M_p,
                          local_570[0].first.field_2._M_allocated_capacity + 1);
          psVar27 = unit_string_00;
        }
        __cxa_atexit(std::__cxx11::string::~string,
                     &cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_);
        unit_string_00 = psVar27;
      }
      paVar2 = &local_570[0].first.field_2;
      local_570[0].first._M_string_length = 7;
      local_570[0].first.field_2._M_allocated_capacity = 0x20657261757173;
      local_570[0].first._M_dataplus._M_p = (pointer)paVar2;
      bVar40 = isolatePriorModifier(psVar27,&local_570[0].first,'d','D');
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_570[0].first._M_dataplus._M_p != paVar2) {
        operator_delete(local_570[0].first._M_dataplus._M_p,
                        local_570[0].first.field_2._M_allocated_capacity + 1);
      }
      local_570[0].first._M_string_length = 6;
      local_570[0].first.field_2._0_7_ = 0x206369627563;
      local_570[0].first._M_dataplus._M_p = (pointer)paVar2;
      bVar5 = isolatePriorModifier(psVar27,&local_570[0].first,'_','-');
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_570[0].first._M_dataplus._M_p != paVar2) {
        operator_delete(local_570[0].first._M_dataplus._M_p,
                        local_570[0].first.field_2._M_allocated_capacity + 1);
      }
      local_570[0].first.field_2._M_allocated_capacity = 0x6465726175717320;
      local_570[0].first._M_string_length = 8;
      local_570[0].first.field_2._M_local_buf[8] = '\0';
      psVar28 = unit_string_00;
      local_570[0].first._M_dataplus._M_p = (pointer)paVar2;
      uVar9 = std::__cxx11::string::find((char *)unit_string_00,(ulong)paVar2,0);
      bVar35 = 0;
      psVar27 = psVar28;
      if (uVar9 != 0xffffffffffffffff) {
        uVar13 = std::__cxx11::string::find_last_not_of((char)unit_string_00,0x20);
        uVar13 = std::__cxx11::string::find_last_of((char *)unit_string_00,0x196d62,uVar13);
        bVar35 = 0;
        psVar27 = psVar28;
        if ((uVar13 != 0) && (bVar35 = 0, uVar13 < unit_string_00->_M_string_length)) {
          pcVar19 = (psVar28->_M_dataplus)._M_p;
          if (pcVar19[uVar13] == ' ') {
            cVar31 = pcVar19[uVar13 + 1];
            bVar41 = true;
            bVar42 = true;
            if ((cVar31 != '*') && (cVar31 != '/')) {
              bVar42 = pcVar19[uVar13 - 1] == '/' || pcVar19[uVar13 - 1] == '*';
            }
            bVar35 = (cVar31 == '*' || cVar31 == '/') | bVar42;
            bVar35 = cVar31 == ')' | bVar35 | bVar35;
            bVar42 = (bool)(cVar31 == '-' | bVar35 | bVar35);
            if (!bVar42) {
              bVar41 = pcVar19[uVar13 - 1] == ')';
            }
            bVar41 = (bool)(bVar41 | bVar42);
            bVar42 = true;
            if (!bVar41) {
              bVar42 = pcVar19[uVar13 - 1] == '-';
            }
            if (!(bool)(bVar42 | bVar41)) {
              cVar31 = (char)psVar28;
              uVar14 = std::__cxx11::string::rfind(cVar31,0x2f);
              if (uVar14 < uVar9) {
                std::__cxx11::string::insert((ulong)psVar28,uVar14 + 1,'\x01');
                uVar9 = std::__cxx11::string::find(cVar31,0x2f);
                if (uVar9 == 0xffffffffffffffff) {
                  std::__cxx11::string::push_back(cVar31);
                  psVar28 = psVar27;
                }
                else {
                  std::__cxx11::string::insert((ulong)psVar28,uVar9,'\x01');
                  psVar28 = psVar27;
                }
                bVar35 = 1;
                psVar27 = psVar28;
                if (uVar9 <= uVar13) goto LAB_0017ae97;
                uVar13 = uVar13 + 1;
              }
              (psVar28->_M_dataplus)._M_p[uVar13] = '*';
              bVar35 = 1;
              goto LAB_0017ae97;
            }
          }
          bVar35 = 0;
        }
      }
LAB_0017ae97:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_570[0].first._M_dataplus._M_p != paVar2) {
        operator_delete(local_570[0].first._M_dataplus._M_p,
                        local_570[0].first.field_2._M_allocated_capacity + 1);
      }
      bVar36 = (byte)local_57c | bVar39;
      bVar35 = (bVar40 || bVar5) | bVar35;
      uVar9 = 0;
      unit_string_00 = psVar27;
LAB_0017aed1:
      while (uVar9 = std::__cxx11::string::find_first_of
                               ((char *)psVar27,
                                cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,uVar9
                               ), uVar9 == 0) {
LAB_0017b27a:
        std::__cxx11::string::erase((ulong)psVar27,0);
        bVar35 = 1;
        uVar9 = 0;
      }
      if (uVar9 == 0xffffffffffffffff) goto LAB_0017b2b6;
      if ((bVar36 & 1) != 0) goto LAB_0017af09;
      uVar13 = std::__cxx11::string::find_first_not_of
                         ((char *)psVar27,
                          cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,uVar9);
      if (uVar13 != 0xffffffffffffffff) {
        if (uVar9 == 1) {
          pcVar19 = (psVar27->_M_dataplus)._M_p;
          if ((0x34 < (byte)pcVar19[uVar13] - 0x2a) ||
             ((0x10000000400021U >> ((ulong)((byte)pcVar19[uVar13] - 0x2a) & 0x3f) & 1) == 0)) {
            if (7 < psVar27->_M_string_length) {
              lVar30 = std::__cxx11::string::find((char)psVar27,0x2a);
              if ((lVar30 != -1) ||
                 (uVar14 = std::__cxx11::string::find_first_of((char *)psVar27,0x1968e7,uVar13),
                 8 < uVar14)) goto LAB_0017aff1;
              pcVar19 = (psVar27->_M_dataplus)._M_p;
            }
            pcVar19[1] = '*';
            bVar35 = 1;
            uVar9 = 1;
            bVar36 = 1;
            goto LAB_0017aed1;
          }
          uVar9 = 1;
LAB_0017b013:
          std::__cxx11::string::erase((ulong)psVar27,uVar9);
        }
        else {
LAB_0017aff1:
          pbVar3 = (byte *)(psVar27->_M_dataplus)._M_p;
          bVar35 = pbVar3[uVar9 - 1];
          if (bVar35 == 0x2f) goto LAB_0017b013;
          if (bVar35 != 0x2e) {
            if ((bVar35 == 0x2a) ||
               ((uVar13 < psVar27->_M_string_length &&
                ((pbVar3[uVar13] == 0x2f || (pbVar3[uVar13] == 0x2a)))))) goto LAB_0017b013;
            pbVar1 = pbVar3 + uVar9;
            pbVar24 = pbVar3;
            if (0 < (long)uVar9 >> 2) {
              lVar30 = ((long)uVar9 >> 2) + 1;
              pbVar32 = pbVar3 + 3;
              do {
                pbVar24 = pbVar32;
                bVar35 = pbVar24[-3];
                in_R9 = (size_t *)(ulong)(bVar35 - 0x30);
                if ((9 < (byte)(bVar35 - 0x30)) &&
                   ((0x2f < bVar35 || ((0xec0000000000U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0)))
                   ) {
                  pbVar24 = pbVar24 + -3;
                  goto LAB_0017b1a1;
                }
                bVar35 = pbVar24[-2];
                in_R9 = (size_t *)(ulong)(bVar35 - 0x30);
                if ((9 < (byte)(bVar35 - 0x30)) &&
                   ((0x2f < bVar35 || ((0xec0000000000U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0)))
                   ) {
                  pbVar24 = pbVar24 + -2;
                  goto LAB_0017b1a1;
                }
                bVar35 = pbVar24[-1];
                in_R9 = (size_t *)(ulong)(bVar35 - 0x30);
                if ((9 < (byte)(bVar35 - 0x30)) &&
                   ((0x2f < bVar35 || ((0xec0000000000U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0)))
                   ) {
                  pbVar24 = pbVar24 + -1;
                  goto LAB_0017b1a1;
                }
                bVar35 = *pbVar24;
                in_R9 = (size_t *)(ulong)(bVar35 - 0x30);
                if ((9 < (byte)(bVar35 - 0x30)) &&
                   ((0x2f < bVar35 || ((0xec0000000000U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0)))
                   ) goto LAB_0017b1a1;
                lVar30 = lVar30 + -1;
                pbVar32 = pbVar24 + 4;
                pbVar24 = pbVar3 + (uVar9 & 0xfffffffffffffffc);
              } while (1 < lVar30);
            }
            lVar30 = (long)pbVar1 - (long)pbVar24;
            if (lVar30 == 1) {
LAB_0017b164:
              bVar35 = *pbVar24;
              if ((9 < (byte)(bVar35 - 0x30)) &&
                 ((0x2f < bVar35 || ((0xec0000000000U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0))))
              goto LAB_0017b1a1;
LAB_0017b293:
              *pbVar1 = 0x2a;
            }
            else {
              if (lVar30 == 2) {
LAB_0017b148:
                bVar35 = *pbVar24;
                if (((byte)(bVar35 - 0x30) < 10) ||
                   ((bVar35 < 0x30 && ((0xec0000000000U >> ((ulong)(uint)bVar35 & 0x3f) & 1) != 0)))
                   ) {
                  pbVar24 = pbVar24 + 1;
                  goto LAB_0017b164;
                }
              }
              else {
                if (lVar30 != 3) goto LAB_0017b293;
                bVar35 = *pbVar24;
                if (((byte)(bVar35 - 0x30) < 10) ||
                   ((bVar35 < 0x30 && ((0xec0000000000U >> ((ulong)(uint)bVar35 & 0x3f) & 1) != 0)))
                   ) {
                  pbVar24 = pbVar24 + 1;
                  goto LAB_0017b148;
                }
              }
LAB_0017b1a1:
              if (pbVar24 == pbVar1) goto LAB_0017b293;
              if (uVar9 == 0) goto LAB_0017b27a;
              uVar13 = 0;
              lVar30 = 0;
              do {
                lVar30 = lVar30 + (ulong)(pbVar3[uVar13] == 0x2f);
                uVar13 = uVar13 + 1;
              } while (uVar9 != uVar13);
              if (((lVar30 == 1) &&
                  (lVar30 = std::__cxx11::string::rfind((char *)psVar27,0x196d50,uVar9),
                  lVar30 == -1)) &&
                 (lVar30 = std::__cxx11::string::rfind((char *)psVar27,0x196d54,uVar9), lVar30 == -1
                 )) {
                lVar30 = std::__cxx11::string::find_first_not_of
                                   ((char *)psVar27,
                                    cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,
                                    uVar9);
                lVar15 = std::__cxx11::string::find_first_of((char *)psVar27,0x196d58,uVar9);
                if (((lVar30 == -1) || (lVar15 == lVar30)) ||
                   (pcVar19 = (psVar27->_M_dataplus)._M_p, (byte)(pcVar19[uVar9 - 1] - 0x30U) < 10))
                goto LAB_0017af09;
                pcVar19[uVar9] = '*';
              }
              else {
LAB_0017af09:
                if ((psVar27->_M_dataplus)._M_p[uVar9 - 1] == '.') {
                  uVar9 = uVar9 + 1;
                  bVar35 = 1;
                  goto LAB_0017aed1;
                }
                std::__cxx11::string::erase((ulong)psVar27,uVar9);
              }
            }
            bVar35 = 1;
            bVar36 = 1;
            goto LAB_0017aed1;
          }
          uVar9 = uVar9 + 1;
        }
        bVar35 = 1;
        bVar36 = 0;
        goto LAB_0017aed1;
      }
      if (psVar27->_M_string_length < uVar9) {
        uVar12 = std::__throw_out_of_range_fmt
                           ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                            "basic_string::erase",uVar9);
        goto LAB_0017c415;
      }
      psVar27->_M_string_length = uVar9;
      (psVar27->_M_dataplus)._M_p[uVar9] = '\0';
      bVar35 = 1;
LAB_0017b2b6:
      if (psVar27->_M_string_length == 0) {
        return true;
      }
      bVar26 = bVar26 | bVar35;
    }
    uVar9 = std::__cxx11::string::find((char *)psVar27,0x196d66,0);
    unit_string = psVar27;
    while (uVar9 != 0xffffffffffffffff) {
      uVar13 = uVar9 + 3;
      if (uVar13 < unit_string->_M_string_length) {
        pcVar19 = (unit_string->_M_dataplus)._M_p;
        bVar35 = pcVar19[uVar13];
        if ((((byte)(bVar35 - 0x30) < 10) ||
            ((bVar35 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar35 & 0x3f) & 1) != 0)))) &&
           ((uVar9 == 0 ||
            ((bVar35 = pcVar19[uVar9 - 1], 9 < (byte)(bVar35 - 0x30) &&
             (((0x3a < bVar35 - 0x2b ||
               ((0x40000000400000dU >> ((ulong)(bVar35 - 0x2b) & 0x3f) & 1) == 0)) ||
              ((uVar9 != 1 && ((bVar35 == 0x2e && ((byte)(pcVar19[uVar9 - 2] - 0x3aU) < 0xf6))))))))
            )))) {
          std::__cxx11::string::substr((ulong)local_570,(ulong)unit_string);
          __nptr._M_p = local_570[0].first._M_dataplus._M_p;
          if (local_570[0].first._M_string_length != 0) {
            cVar31 = *local_570[0].first._M_dataplus._M_p;
            if ((cVar31 == '-') || (cVar31 == '+')) {
              cVar31 = local_570[0].first._M_dataplus._M_p[1];
              uVar14 = 2;
            }
            else {
              uVar14 = 1;
            }
            if ((byte)(cVar31 - 0x30U) < 10) {
              if (uVar14 < local_570[0].first._M_string_length) {
                do {
                  uVar37 = uVar14 + 1;
                  if (9 < (byte)(local_570[0].first._M_dataplus._M_p[uVar14] - 0x30U)) {
                    uVar6 = (byte)local_570[0].first._M_dataplus._M_p[uVar14] - 0x2e;
                    if ((((uVar6 < 0x38) && ((0x80000000800001U >> ((ulong)uVar6 & 0x3f) & 1) != 0))
                        && (uVar37 < local_570[0].first._M_string_length)) &&
                       (((byte)(local_570[0].first._M_dataplus._M_p[uVar37] - 0x30U) < 10 ||
                        ((local_570[0].first._M_dataplus._M_p[uVar37] - 0x2bU & 0xfd) == 0))))
                    goto LAB_0017b4c0;
                    break;
                  }
                  uVar14 = uVar37;
                } while (uVar37 != local_570[0].first._M_string_length);
              }
              puVar16 = (uint *)__errno_location();
              uVar6 = *puVar16;
              psVar27 = (string *)(ulong)uVar6;
              *puVar16 = 0;
              unit_string = unit_string_00;
              lVar30 = strtol(__nptr._M_p,(char **)&local_588,10);
              if (local_588 == (string *)__nptr._M_p) {
                uVar12 = std::__throw_invalid_argument("stoi");
LAB_0017c415:
                if ((string *)local_570[0].first._M_dataplus._M_p != psVar27) {
                  operator_delete(local_570[0].first._M_dataplus._M_p,
                                  local_570[0].first.field_2._M_allocated_capacity + 1);
                }
                __cxa_guard_abort(&cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_);
                _Unwind_Resume(uVar12);
              }
              uVar8 = (uint)lVar30;
              if (((int)uVar8 != lVar30) || (*puVar16 == 0x22)) {
                uVar12 = std::__throw_out_of_range("stoi");
                goto LAB_0017c415;
              }
              if (*puVar16 == 0) {
                *puVar16 = uVar6;
              }
              uVar6 = -uVar8;
              if (0 < (int)uVar8) {
                uVar6 = uVar8;
              }
              unit_string_00 = unit_string;
              if (uVar6 < 0x27) {
                std::__cxx11::string::replace((ulong)unit_string,uVar9,(char *)0x3,0x196ad0);
              }
            }
          }
LAB_0017b4c0:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_570[0].first._M_dataplus._M_p != &local_570[0].first.field_2) {
            operator_delete(local_570[0].first._M_dataplus._M_p,
                            local_570[0].first.field_2._M_allocated_capacity + 1);
          }
        }
      }
      uVar9 = std::__cxx11::string::find((char *)unit_string,0x196d66,uVar13);
    }
  }
  else {
    local_598 = std::__cxx11::string::find((char *)unit_string,0x196be8,0);
  }
  if ((*(unit_string->_M_dataplus)._M_p == '(') &&
     (removeOuterParenthesis(unit_string), unit_string->_M_string_length == 0)) {
    return true;
  }
  if ((match_flags >> 0x24 & 1) == 0) {
    bVar39 = ReplaceStringInPlace(unit_string,"**",2,"^",(int)local_570,in_R9);
    bVar26 = bVar39 | bVar26;
  }
  local_5a0 = (uint)match_flags;
  if ((local_5a0 >> 9 & 1) != 0) {
    if ((ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_ == '\0') &&
       (iVar7 = __cxa_guard_acquire(&ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_),
       iVar7 != 0)) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                (local_570,(char (*) [2])0x196d8c,(char (*) [2])0x18fad3);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                (local_570 + 1,(char (*) [2])0x196d8f,(char (*) [2])0x193883);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                (local_570 + 2,(char (*) [2])0x1981ae,(char (*) [2])0x19265d);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (local_570 + 3,(char (*) [3])"MM",(char (*) [3])0x1a1dfa);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_470,(char (*) [3])"NM",(char (*) [3])"nm");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_430,(char (*) [3])"ML",(char (*) [3])0x191dcb);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_3f0,(char (*) [3])0x197da4,(char (*) [3])"Gs");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[4],_true>
                (&local_3b0,(char (*) [3])0x1a1c43,(char (*) [4])0x199e64);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_370,(char (*) [3])"MG",(char (*) [3])"mg");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[4],_const_char_(&)[4],_true>
                (&local_330,(char (*) [4])"[G]",(char (*) [4])"[g]");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_2f0,(char (*) [3])"PG",(char (*) [3])"pg");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_2b0,(char (*) [3])0x197c70,(char (*) [3])0x192afd);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_270,(char (*) [3])"UG",(char (*) [3])0x19e126);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_230,(char (*) [3])0x196b81,(char (*) [3])0x194fbc);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_1f0,(char (*) [3])0x19e189,(char (*) [3])0x193537);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[4],_const_char_(&)[4],_true>
                (&local_1b0,(char (*) [4])"RAD",(char (*) [4])0x1926b8);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[8],_true>
                (&local_170,(char (*) [3])"GB",(char (*) [8])"gilbert");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_130,(char (*) [3])"WB",(char (*) [3])"Wb");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_f0,(char (*) [3])"CP",(char (*) [3])"cP");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_b0,(char (*) [3])"EV",(char (*) [3])"eV");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_70,(char (*) [3])0x19af9e,(char (*) [3])"pT");
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_Hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_,local_570,
                 &stack0xffffffffffffffd0,0,&local_588,&local_589,&local_58a);
      lVar30 = 0x500;
      unit_string = unit_string_00;
      do {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&local_570[0].first._M_dataplus._M_p + lVar30));
        lVar30 = lVar30 + -0x40;
      } while (lVar30 != -0x40);
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~unordered_map,ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_);
      unit_string_00 = unit_string;
    }
    sVar21 = unit_string->_M_string_length;
    if (sVar21 != 0) {
      pcVar19 = (unit_string_00->_M_dataplus)._M_p;
      sVar38 = 0;
      do {
        iVar7 = toupper((int)pcVar19[sVar38]);
        pcVar19[sVar38] = (char)iVar7;
        sVar38 = sVar38 + 1;
      } while (sVar21 != sVar38);
    }
    unit_string = unit_string_00;
    cVar17 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_,unit_string_00)
    ;
    if (cVar17.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      pcVar25 = (unit_string_00->_M_dataplus)._M_p;
      if (*pcVar25 == 'P') {
        cVar31 = 'p';
LAB_0017b622:
        *pcVar25 = cVar31;
        pcVar25 = (unit_string->_M_dataplus)._M_p;
      }
      else if (*pcVar25 == 'M') {
        cVar31 = 'm';
        goto LAB_0017b622;
      }
      sVar21 = unit_string->_M_string_length;
      unit_string_00 = unit_string;
      if (pcVar25[sVar21 - 1] == 'M') {
        if (sVar21 == 3) {
          dVar43 = getPrefixMultiplier2Char(*pcVar25,pcVar25[1]);
          unit_string_00 = unit_string;
        }
        else {
          if (sVar21 != 2) goto LAB_0017b685;
          dVar43 = getPrefixMultiplier(*pcVar25);
        }
        if ((dVar43 != 0.0) || (NAN(dVar43))) {
          pcVar25[sVar21 - 1] = 'm';
        }
      }
    }
    else {
      psVar27 = unit_string;
      std::__cxx11::string::_M_assign((string *)unit_string_00);
      unit_string = unit_string_00;
      unit_string_00 = psVar27;
    }
LAB_0017b685:
    lVar30 = std::__cxx11::string::find((char *)unit_string,0x196d8b,0);
    if (lVar30 != -1) {
      (unit_string->_M_dataplus)._M_p[lVar30 + 1] = 's';
    }
    lVar30 = std::__cxx11::string::find((char *)unit_string,0x196d8e,0);
    bVar26 = 1;
    if (lVar30 != -1) {
      (unit_string->_M_dataplus)._M_p[lVar30 + 1] = 'g';
    }
  }
  if ((match_flags >> 0x24 & 1) == 0) {
    lVar30 = std::__cxx11::string::rfind((char)unit_string,0x3c);
    if (lVar30 != -1) {
      uVar9 = std::__cxx11::string::find((char *)unit_string,0x196d91,0);
      while (uVar9 != 0xffffffffffffffff) {
        std::__cxx11::string::replace((ulong)unit_string,uVar9,(char *)0x5,0x196dbe);
        uVar9 = std::__cxx11::string::find((char *)unit_string,0x196d97,0);
        if (uVar9 == 0xffffffffffffffff) {
          uVar9 = std::__cxx11::string::find((char *)unit_string,0x196d9e,0);
          if (uVar9 != 0xffffffffffffffff) {
            pcVar25 = (char *)0x8;
            goto LAB_0017b79a;
          }
        }
        else {
          pcVar25 = (char *)0x6;
LAB_0017b79a:
          std::__cxx11::string::replace((ulong)unit_string,uVar9,pcVar25,0x191a3d);
        }
        uVar9 = std::__cxx11::string::find((char *)unit_string,0x196d91,0);
      }
      uVar9 = std::__cxx11::string::find((char *)unit_string,0x196da6,0);
      while (uVar9 != 0xffffffffffffffff) {
        std::__cxx11::string::replace((ulong)unit_string,uVar9,(char *)0x5,0x197ad0);
        uVar9 = std::__cxx11::string::find((char *)unit_string,0x196dac,0);
        if (uVar9 == 0xffffffffffffffff) {
          uVar9 = std::__cxx11::string::find((char *)unit_string,0x196db3,0);
          if (uVar9 != 0xffffffffffffffff) {
            pcVar25 = (char *)0x8;
            goto LAB_0017b85b;
          }
        }
        else {
          pcVar25 = (char *)0x6;
LAB_0017b85b:
          std::__cxx11::string::replace((ulong)unit_string,uVar9,pcVar25,0x191a3d);
        }
        uVar9 = std::__cxx11::string::find((char *)unit_string,0x196da6,0);
      }
    }
    lVar30 = 0;
    psVar27 = unit_string_00;
    do {
      pcVar25 = *(char **)((long)&cleanUnitString::allCodeReplacements._M_elems[0].first + lVar30);
      strlen(pcVar25);
      uVar9 = std::__cxx11::string::find((char *)psVar27,(ulong)pcVar25,0);
      unit_string_00 = psVar27;
      if (uVar9 != 0xffffffffffffffff) {
        pcVar10 = *(char **)((long)&cleanUnitString::allCodeReplacements._M_elems[0].second + lVar30
                            );
        do {
          pcVar23 = (char *)strlen(pcVar25);
          strlen(pcVar10);
          std::__cxx11::string::replace((ulong)psVar27,uVar9,pcVar23,(ulong)pcVar10);
          strlen(pcVar25);
          uVar9 = std::__cxx11::string::find((char *)psVar27,(ulong)pcVar25,uVar9 + 1);
        } while (uVar9 != 0xffffffffffffffff);
        bVar26 = 1;
      }
      lVar30 = lVar30 + 0x10;
      psVar27 = unit_string_00;
    } while (lVar30 != 0x250);
  }
  uVar9 = unit_string_00->_M_string_length;
  psVar27 = unit_string_00;
  if ((1 < uVar9) &&
     (pcVar19 = (unit_string_00->_M_dataplus)._M_p, (pcVar19[uVar9 - 1] & 0xfeU) == 0x32)) {
    pcVar25 = pcVar19 + (uVar9 - 1);
    if (((pcVar19[uVar9 - 2] == '-') || (pcVar19[uVar9 - 2] == '+')) && (uVar9 != 2)) {
      pcVar25 = pcVar19 + (uVar9 - 2);
    }
    if (9 < (byte)(pcVar25[-1] - 0x30U)) {
      uVar6 = (byte)pcVar25[-1] - 0x2a;
      if (uVar6 < 0x3c) {
        if ((0x81000000800003aU >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
          if ((ulong)uVar6 != 0) goto LAB_0017bf8b;
          pcVar25[-1] = '^';
        }
      }
      else {
LAB_0017bf8b:
        if (*pcVar25 == '+') {
          *pcVar25 = '^';
        }
        else {
          std::__cxx11::string::_M_replace_aux
                    ((ulong)unit_string_00,(long)pcVar25 - (long)pcVar19,0,'\x01');
        }
      }
    }
  }
  if ((match_flags >> 0x24 & 1) != 0) goto LAB_0017c507;
  lVar30 = std::__cxx11::string::rfind((char)unit_string_00,0x2e);
  if ((lVar30 == -1) || ((byte)((unit_string_00->_M_dataplus)._M_p[lVar30 + 1] - 0x30U) < 10))
  goto LAB_0017bd53;
  iVar7 = 0;
  lVar30 = std::__cxx11::string::find((char)unit_string_00,0x2e);
  if (lVar30 != -1) {
    cVar29 = '\0';
    cVar31 = '\0';
    unit_string_00 = psVar27;
LAB_0017b9f7:
    if (lVar30 == 0) {
      if ((1 < unit_string_00->_M_string_length) &&
         (cVar31 = cVar29, 9 < (byte)((unit_string_00->_M_dataplus)._M_p[1] - 0x30U))) {
        cVar31 = '\x01';
        cVar29 = cVar31;
      }
      goto LAB_0017ba7a;
    }
    cVar20 = cVar31;
    if (lVar30 == -1) goto LAB_0017bb1f;
    pcVar19 = (unit_string_00->_M_dataplus)._M_p;
    if ((byte)(pcVar19[lVar30 + -1] - 0x30U) < 10) {
      cVar22 = pcVar19[lVar30 + 1];
      if ((byte)(cVar22 - 0x30U) < 10) goto LAB_0017ba7a;
    }
    else {
      if (pcVar19[lVar30 + -1] == '*') {
        cVar20 = '\x02';
LAB_0017bb1f:
        bVar39 = cVar20 == '\x01';
        psVar28 = unit_string_00;
        psVar27 = unit_string_00;
        goto LAB_0017bb33;
      }
      cVar22 = pcVar19[lVar30 + 1];
    }
    cVar20 = '\x02';
    if (cVar22 == ' ') goto LAB_0017bb1f;
    cVar31 = '\x01';
    cVar29 = '\x01';
    if (lVar30 == unit_string_00->_M_string_length - 1) goto LAB_0017bb1f;
LAB_0017ba7a:
    lVar30 = std::__cxx11::string::find((char)unit_string_00,0x2e);
    goto LAB_0017b9f7;
  }
  bVar39 = false;
  psVar28 = psVar27;
LAB_0017bb33:
  while( true ) {
    while( true ) {
      uVar9 = std::__cxx11::string::find((char)unit_string_00,0x2e);
      if (uVar9 != 0) break;
      if (1 < unit_string_00->_M_string_length) {
        pcVar25 = (unit_string_00->_M_dataplus)._M_p;
        if ((byte)(pcVar25[1] - 0x30U) < 10) {
          iVar7 = iVar7 + 1;
        }
        else if (bVar39) {
          *pcVar25 = '*';
        }
        else {
          while ((*pcVar25 == '.' || (*pcVar25 == ' '))) {
            std::__cxx11::string::erase((ulong)unit_string_00,0);
            pcVar25 = (unit_string_00->_M_dataplus)._M_p;
          }
        }
      }
    }
    if (uVar9 == 0xffffffffffffffff) break;
    pcVar19 = (unit_string_00->_M_dataplus)._M_p;
    if ((byte)(pcVar19[uVar9 - 1] - 0x30U) < 10) {
      if ((byte)(pcVar19[uVar9 + 1] - 0x30U) < 10) goto LAB_0017bba0;
LAB_0017bb72:
      if (bVar39) {
        pcVar19[uVar9] = '*';
      }
      else {
        while ((unit_string_00 = psVar28, pcVar19[uVar9] == '.' ||
               (psVar28 = unit_string_00, pcVar19[uVar9] == ' '))) {
          std::__cxx11::string::erase((ulong)psVar27,uVar9);
          psVar28 = unit_string_00;
          pcVar19 = (psVar27->_M_dataplus)._M_p;
        }
      }
    }
    else {
      if (pcVar19[uVar9 - 1] != '*') goto LAB_0017bb72;
LAB_0017bba0:
      iVar7 = iVar7 + 1;
    }
  }
  psVar27 = psVar28;
  if (iVar7 < 2) {
LAB_0017bcaf:
    if (0 < iVar7) {
LAB_0017bcc1:
      lVar30 = std::__cxx11::string::find((char)unit_string_00,0x2e);
      if (lVar30 != -1) {
        pcVar19 = (unit_string_00->_M_dataplus)._M_p;
        lVar15 = lVar30;
        do {
          lVar15 = lVar15 + -1;
          if (lVar15 == 0) goto LAB_0017bcc1;
          bVar26 = pcVar19[lVar15];
        } while ((byte)(bVar26 - 0x30) < 10);
        if ((bVar26 | 0x20) == 0x65) {
          pcVar19[lVar30] = '*';
        }
        goto LAB_0017bcc1;
      }
    }
  }
  else {
    iVar7 = 0;
    lVar30 = std::__cxx11::string::find((char)unit_string_00,0x2e);
    psVar27 = psVar28;
    if (lVar30 != -1) {
      do {
        pcVar19 = (unit_string_00->_M_dataplus)._M_p;
        lVar15 = lVar30;
        do {
          lVar15 = lVar15 + 1;
          unit_string_00 = psVar27;
          if (pcVar19[lVar15] == '.') goto LAB_0017bc8d;
        } while ((byte)(pcVar19[lVar15] - 0x30U) < 10);
        lVar30 = std::__cxx11::string::find((char)psVar28,0x2e);
        pcVar19 = (psVar28->_M_dataplus)._M_p;
        if (pcVar19[lVar15] == '.') {
LAB_0017bc8d:
          pcVar19[lVar15] = '*';
          psVar27 = unit_string_00;
          lVar30 = std::__cxx11::string::find((char)unit_string_00,0x2e);
        }
        else {
          iVar7 = iVar7 + 1;
          psVar27 = unit_string_00;
        }
      } while (lVar30 != -1);
      goto LAB_0017bcaf;
    }
  }
  bVar26 = 1;
  if ((local_5a0 >> 10 & 1) != 0) {
    lVar30 = std::__cxx11::string::rfind((char)unit_string_00,0x2f);
    if (lVar30 != -1) {
      std::__cxx11::string::insert((ulong)unit_string_00,lVar30 + 1,'\x01');
      std::__cxx11::string::push_back((char)unit_string_00);
    }
  }
LAB_0017bd53:
  for (uVar9 = std::__cxx11::string::find((char *)unit_string_00,0x1920c4,0);
      uVar9 != 0xffffffffffffffff;
      uVar9 = std::__cxx11::string::find((char *)unit_string_00,0x1920c4,uVar9)) {
    if ((uVar9 + 2 < unit_string_00->_M_string_length) &&
       ((unit_string_00->_M_dataplus)._M_p[uVar9 + 2] == '^')) {
      std::__cxx11::string::replace((ulong)unit_string_00,uVar9,(char *)0x2,0x196bec);
    }
    else {
      std::__cxx11::string::erase((ulong)unit_string_00,uVar9);
    }
  }
  clearEmptySegments(unit_string_00);
  for (sVar18 = std::__cxx11::string::find((char *)unit_string_00,0x196dbb,0);
      sVar18 != 0xffffffffffffffff;
      sVar18 = std::__cxx11::string::find((char *)unit_string_00,0x196dbb,sVar18)) {
    pcVar19 = (unit_string_00->_M_dataplus)._M_p;
    cVar31 = pcVar19[sVar18 + 4];
    if ((cVar31 == '-') || (sz = 4, cVar31 == '+')) {
      if (unit_string_00->_M_string_length <= sVar18 + 5) {
        multiplyRep(unit_string_00,sVar18,5);
        break;
      }
      cVar31 = pcVar19[sVar18 + 5];
      sz = 5;
    }
    if ((byte)(cVar31 - 0x30U) < 10) {
      do {
        sz = sz + 1;
        if (unit_string_00->_M_string_length <= sz + sVar18) break;
      } while ((byte)(pcVar19[sz + sVar18] - 0x30U) < 10);
    }
    multiplyRep(unit_string_00,sVar18,sz);
  }
  uVar9 = std::__cxx11::string::find((char *)unit_string_00,0x196dc0,0);
  while (uVar9 != 0xffffffffffffffff) {
    uVar13 = uVar9 + 2;
    if ((unit_string_00->_M_string_length <= uVar13) ||
       (9 < (byte)((unit_string_00->_M_dataplus)._M_p[uVar13] - 0x30U))) {
      std::__cxx11::string::erase((ulong)unit_string_00,uVar9);
      uVar13 = uVar9;
    }
    uVar9 = std::__cxx11::string::find((char *)unit_string_00,0x196dc0,uVar13);
  }
  for (sVar18 = std::__cxx11::string::find((char *)unit_string_00,0x196dc3,0);
      sVar18 != 0xffffffffffffffff;
      sVar18 = std::__cxx11::string::find((char *)unit_string_00,0x196dc3,sVar18)) {
    multiplyRep(unit_string_00,sVar18,4);
  }
  if (unit_string_00->_M_string_length == 0) {
    std::__cxx11::string::push_back((char)unit_string_00);
    return true;
  }
  do {
    do {
      bVar35 = *(unit_string_00->_M_dataplus)._M_p;
      if (((1 < bVar35 - 0x29) && (bVar35 != 0x7d)) && (bVar35 != 0x5d)) goto LAB_0017c558;
      std::__cxx11::string::erase((ulong)unit_string_00,0);
      if (unit_string_00->_M_string_length == 0) {
        return true;
      }
      bVar26 = 1;
    } while (*(unit_string_00->_M_dataplus)._M_p != '(');
    removeOuterParenthesis(unit_string_00);
    bVar26 = 1;
LAB_0017c507:
  } while (unit_string_00->_M_string_length != 0);
LAB_0017c558:
  uVar13 = std::__cxx11::string::find_first_of((char *)unit_string_00,0x196bef,0);
  uVar9 = unit_string_00->_M_string_length;
  if (uVar13 < local_598 && uVar13 < uVar9 - 1) {
    do {
      uVar14 = uVar13 + 1;
      pcVar19 = (unit_string_00->_M_dataplus)._M_p;
      bVar35 = pcVar19[uVar13 + 1];
      uVar6 = (uint)bVar35;
      uVar37 = uVar14;
      if (bVar35 < 0x6f) {
        if ((0x35 < uVar6 - 0x29) ||
           ((0x30000000200043U >> ((ulong)(uVar6 - 0x29) & 0x3f) & 1) == 0)) goto LAB_0017c64e;
      }
      else if (bVar35 != 0x7d) {
        if (uVar6 == 0x7b) {
          if (pcVar19[uVar13] == '}') goto LAB_0017c64e;
        }
        else if (uVar6 == 0x6f) {
          uVar37 = uVar13 + 3;
          if (((uVar9 <= uVar37) || (pcVar19[uVar13 + 2] != 'f')) ||
             ((cVar31 = pcVar19[uVar37], cVar31 == ')' || ((cVar31 == '}' || (cVar31 == ']')))))) {
            std::__cxx11::string::insert((ulong)unit_string_00,uVar14,'\x01');
          }
        }
        else {
LAB_0017c64e:
          if (pcVar19[uVar13 - 1] != '\\') {
            std::__cxx11::string::insert((ulong)unit_string_00,uVar14,'\x01');
            uVar37 = uVar13 + 2;
          }
        }
      }
      uVar13 = std::__cxx11::string::find_first_of((char *)unit_string_00,0x196bef,uVar37);
    } while ((uVar13 < local_598) && (uVar9 = unit_string_00->_M_string_length, uVar13 < uVar9 - 1))
    ;
  }
  cVar31 = (char)unit_string_00;
  uVar13 = std::__cxx11::string::find(cVar31,0x5e);
  sVar21 = unit_string_00->_M_string_length;
  uVar9 = sVar21 - 3;
  if (uVar13 < local_598 && uVar13 < uVar9) {
    do {
      pcVar19 = (unit_string_00->_M_dataplus)._M_p;
      uVar14 = uVar13 + 1;
      if (pcVar19[uVar13 + 1] != '-') {
        uVar14 = uVar13;
      }
      if (uVar14 < uVar9) {
        uVar9 = sVar21 - 1;
        if ((byte)(pcVar19[uVar14 + 1] - 0x30U) < 10) {
          lVar30 = 0;
          do {
            if (uVar9 < uVar14 + 1 + lVar30) break;
            lVar15 = lVar30 + uVar14 + 2;
            lVar30 = lVar30 + 1;
          } while ((byte)(pcVar19[lVar15] - 0x30U) < 10);
          uVar14 = lVar30 + 1U + uVar14;
          if (uVar9 < uVar14) goto LAB_0017c773;
          if (1 < lVar30 + 1U) {
            uVar6 = (byte)pcVar19[uVar14] - 0x2a;
            if (((0x3b < uVar6) || ((0x810000008000021U >> ((ulong)uVar6 & 0x3f) & 1) == 0)) &&
               (pcVar19[uVar14] != 0)) {
              std::__cxx11::string::insert((ulong)unit_string_00,uVar14,'\x01');
            }
          }
        }
        else if (uVar9 <= uVar14) break;
      }
      uVar13 = std::__cxx11::string::find(cVar31,0x5e);
      sVar21 = unit_string_00->_M_string_length;
      if ((local_598 <= uVar13) || (uVar9 = sVar21 - 3, uVar9 <= uVar13)) break;
    } while( true );
  }
  if (sVar21 != 0) {
LAB_0017c773:
    if (*(unit_string_00->_M_dataplus)._M_p == '/') {
      std::__cxx11::string::_M_replace_aux((ulong)unit_string_00,0,0,'\x01');
      bVar26 = 1;
    }
  }
  if (((match_flags >> 0x24 & 1) == 0) &&
     (pcVar19 = (pointer)std::__cxx11::string::find(cVar31,0x7b),
     pcVar19 != (pointer)0xffffffffffffffff)) {
    do {
      local_570[0].first._M_dataplus._M_p = pcVar19 + 1;
      bVar39 = segmentcheck(unit_string_00,'}',(size_t *)local_570);
      if (!bVar39) break;
      pcVar4 = (unit_string_00->_M_dataplus)._M_p;
      unit_string_00 = psVar27;
      if (pcVar19 + (long)(pcVar4 + 1) != local_570[0].first._M_dataplus._M_p + (long)(pcVar4 + -1))
      {
        pcVar34 = local_570[0].first._M_dataplus._M_p + -2;
        do {
          iVar7 = tolower((int)pcVar19[(long)(pcVar4 + 1)]);
          pcVar19[(long)(pcVar4 + 1)] = (char)iVar7;
          pcVar19 = pcVar19 + 1;
          unit_string_00 = psVar27;
        } while (pcVar34 != pcVar19);
      }
      psVar27 = unit_string_00;
      pcVar19 = (pointer)std::__cxx11::string::find((char)unit_string_00,0x7b);
    } while (pcVar19 != (pointer)0xffffffffffffffff);
  }
  if (bVar26 == 0) {
    return unit_string_00->_M_string_length != local_578;
  }
  return true;
}

Assistant:

static bool cleanUnitString(std::string& unit_string, std::uint64_t match_flags)
{
    auto slen = unit_string.size();
    bool skipcodereplacement = ((match_flags & skip_code_replacements) != 0);
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<ckpair, 4>
        earlyCodeReplacements{{
            ckpair{"degree", "deg"},
            ckpair{"Degree", "deg"},
            ckpair{"degs ", "deg"},
            ckpair{"deg ", "deg"},
        }};

    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<ckpair, 37>
        allCodeReplacements{{
            ckpair{"sq.", "square"},
            ckpair{"cu.", "cubic"},
            ckpair{"U.S.A.", "US"},
            ckpair{"U.S.", "US"},
            ckpair{"10^", "1e"},
            ckpair{"10-", "1e-"},
            ckpair{"^+", "^"},
            ckpair{"'s", "s"},
            ckpair{"ampere", "amp"},
            ckpair{"Ampere", "amp"},
            ckpair{"metre", "meter"},
            ckpair{"Metre", "meter"},
            ckpair{"litre", "liter"},
            ckpair{"Litre", "liter"},
            ckpair{"B.Th.U.", "BTU"},
            ckpair{"B.T.U.", "BTU"},
            ckpair{"Britishthermalunits", "BTU"},
            ckpair{"Britishthermalunitat", "BTU"},
            ckpair{"Britishthermalunit", "BTU"},
            ckpair{"BritishThermalUnits", "BTU"},
            ckpair{"BritishThermalUnitAt", "BTU"},
            ckpair{"BritishThermalUnit", "BTU"},
            ckpair{"BThU", "BTU"},
            ckpair{"-US", "US"},
            ckpair{"--", "*"},
            // -- is either a double negative or a separator, so make it a
            // multiplier so it doesn't get erased and then converted to a
            // power
            ckpair{"\\\\", "\\\\*"},
            // \\ is always considered a segment terminator so it won't be
            // misinterpreted as a known escape sequence
            ckpair{"perunit", "pu"},
            ckpair{"percent", "%"},
            ckpair{"per-unit", "pu"},
            ckpair{"per unit ", "pu"},
            ckpair{"/square*", "/square"},
            ckpair{"/cubic*", "/cubic"},
            ckpair{"Hz^0.5", "rootHertz"},
            ckpair{"Hz^.5", "rootHertz"},
            ckpair{"Hz^(1/2)", "rootHertz"},
            ckpair{"Hz^1/2", "rootHertz"},
            ckpair{u8"\u221AHz", "rootHertz"},
        }};

    static const std::string spchar = std::string(" \t\n\r") + '\0';
    bool changed = false;
    bool skipMultiply = false;
    std::size_t skipMultiplyInsertionAfter{std::string::npos};
    char tail = unit_string.back();
    if (tail == '^' || tail == '*' || tail == '/') {
        unit_string.pop_back();
        changed = true;
    }
    auto c = unit_string.find_first_not_of(spchar);
    if (c == std::string::npos) {
        unit_string.clear();
        return true;
    }
    if (c != 0) {
        unit_string.erase(0, c);
        c = unit_string.find_first_not_of(spchar);
        changed = true;
    }
    if (unit_string[c] == '/') {
        unit_string.insert(c, 1, '1');
        changed = true;
        skipMultiply = true;
    }
    if (!skipcodereplacement) {
        // Check for unicode or extended characters
        if (std::any_of(unit_string.begin(), unit_string.end(), [](char x) {
                return (static_cast<std::uint8_t>(x) & 0x80U) != 0;
            })) {
            if (unicodeReplacement(unit_string)) {
                changed = true;
            }
        }

        // some code replacement that needs to be done before single character
        // and space replacements
        for (const auto& acode : earlyCodeReplacements) {
            auto fnd = unit_string.find(acode.first);
            while (fnd != std::string::npos) {
                changed = true;
                unit_string.replace(fnd, strlen(acode.first), acode.second);
                fnd = unit_string.find(acode.first, fnd + 1);
            }
        }

        if (unit_string.find_first_of(spchar) != std::string::npos) {
            // deal with some particular string with a space in them
            std::size_t reploc{0};
            // clean up some "per" words
            if (unit_string.compare(0, 4, "per ") == 0) {
                reploc = 2;
                unit_string.replace(0, 4, "1/");
                skipMultiply = true;
            }
            if (ReplaceStringInPlace(unit_string, " per ", 5, "/", 1, reploc)) {
                skipMultiply = true;
            }
            if (reploc > 0) {
                auto ploc = unit_string.find_first_of('(', reploc);
                if (ploc != std::string::npos) {
                    auto fdiv = unit_string.find_first_of('/', reploc);
                    std::size_t ndiv{0};
                    do {
                        ndiv = unit_string.find_first_of('/', fdiv + 1);
                        if (ploc < ndiv) {
                            if (ndiv != std::string::npos) {
                                unit_string.insert(ndiv, 1, ')');
                            } else {
                                unit_string.push_back(')');
                            }
                            unit_string.insert(fdiv + 1, 1, '(');
                            fdiv = ndiv + 2;
                        } else {
                            fdiv = ndiv;
                        }
                    } while (ndiv != std::string::npos);
                }
            }
            checkShortUnits(unit_string, match_flags);
            auto fndP = unit_string.find(" of ");
            while (fndP != std::string::npos) {
                auto nchar = unit_string.find_first_not_of(spchar, fndP + 4);
                if (nchar != std::string::npos) {
                    if (unit_string[nchar] == '(' ||
                        unit_string[nchar] == '[') {
                        skipMultiplyInsertionAfter = fndP;
                        break;
                    }
                }
                fndP = unit_string.find(" of ", fndP + 3);
            }
            changed |= cleanSpaces(unit_string, skipMultiply);
            if (unit_string.empty()) {
                // LCOV_EXCL_START
                return true;
                // LCOV_EXCL_STOP
            }
        }

        checkPowerOf10(unit_string);
    } else {
        auto fndP = unit_string.find("of(");
        if (fndP != std::string::npos) {
            skipMultiplyInsertionAfter = fndP;
        }
    }
    if (unit_string.front() == '(') {
        removeOuterParenthesis(unit_string);
        if (unit_string.empty()) {
            return true;
        }
    }

    if (!skipcodereplacement) {
        // ** means power in some environments
        std::size_t loc{0};
        if (ReplaceStringInPlace(unit_string, "**", 2, "^", 1, loc)) {
            changed = true;
        }
    }
    if ((match_flags & case_insensitive) != 0) {
        ciConversion(unit_string);
        changed = true;
    }
    if (!skipcodereplacement) {
        // deal with some html stuff
        auto bloc = unit_string.find_last_of('<');
        if (bloc != std::string::npos) {
            htmlCodeReplacement(unit_string);
        }
        // some abbreviations and other problematic code replacements
        for (const auto& acode : allCodeReplacements) {
            auto fnd = unit_string.find(acode.first);
            while (fnd != std::string::npos) {
                changed = true;
                unit_string.replace(fnd, strlen(acode.first), acode.second);
                fnd = unit_string.find(acode.first, fnd + 1);
            }
        }
    }
    if (unit_string.size() >= 2) {
        auto eit = unit_string.end() - 1;
        if (*(eit) == '2' || *(eit) == '3') {
            if ((*(eit - 1) == '-' || *(eit - 1) == '+') &&
                unit_string.size() >= 3) {
                --eit;
            }
            if (!isDigitCharacter(*(eit - 1))) {
                switch (*(eit - 1)) {
                    case '^':
                    case 'e':
                    case 'E':
                    case '/':
                    case '+':
                    case '-':
                    case '.':
                        break;
                    case '*':
                        *(eit - 1) = '^';
                        break;
                    default:
                        if (eit[0] != '+') {
                            unit_string.insert(eit, '^');
                        } else {
                            *eit = '^';
                        }

                        break;
                }
            }
        }
    }
    if (!skipcodereplacement) {
        // handle dot notation for multiplication
        auto dotloc = unit_string.find_last_of('.');
        if (dotloc < std::string::npos) {
            // strings always have a null pointer at the end
            if (!isDigitCharacter(unit_string[dotloc + 1])) {
                cleanDotNotation(unit_string, match_flags);
                changed = true;
            }
        }

        // clear empty parenthesis
        auto fndP = unit_string.find("()");
        while (fndP != std::string::npos) {
            if (unit_string.size() > fndP + 2) {
                if (unit_string[fndP + 2] == '^') {
                    unit_string.replace(fndP, 2, "*1");
                } else {
                    unit_string.erase(fndP, 2);
                }
            } else {
                unit_string.erase(fndP, 2);
            }
            fndP = unit_string.find("()", fndP);
        }
        // clear empty brackets, this would indicate commodities but if
        // empty there is no commodity
        clearEmptySegments(unit_string);
        cleanUpPowersOfOne(unit_string);
        if (unit_string.empty()) {
            unit_string.push_back('1');
            return true;
        }
    }
    // remove leading *})],  equivalent of 1* but we don't need to process
    // that further
    while (!unit_string.empty() &&
           (unit_string.front() == '*' || unit_string.front() == '}' ||
            unit_string.front() == ')' || unit_string.front() == ']')) {
        unit_string.erase(0, 1);
        changed = true;
        if (unit_string.empty()) {
            return true;
        }
        // check for parenthesis again
        if (unit_string.front() == '(') {
            removeOuterParenthesis(unit_string);
        }
    }
    // inject multiplies after bracket terminators
    auto fnd = unit_string.find_first_of(")]}");
    while (fnd < unit_string.size() - 1 && fnd < skipMultiplyInsertionAfter) {
        switch (unit_string[fnd + 1]) {
            case '^':
            case '*':
            case '/':
            case ')':
            case ']':
            case '}':
            case '>':
                fnd = unit_string.find_first_of(")]}", fnd + 1);
                break;
            case 'o':  // handle special case of commodity modifier using
                       // "of"
                if (unit_string.size() > fnd + 3) {
                    auto tc2 = unit_string[fnd + 3];
                    if (unit_string[fnd + 2] == 'f' && tc2 != ')' &&
                        tc2 != ']' && tc2 != '}') {
                        fnd = unit_string.find_first_of(")]}", fnd + 3);
                        break;
                    }
                }
                unit_string.insert(fnd + 1, 1, '*');
                fnd = unit_string.find_first_of(")]}", fnd + 3);
                break;
            case '{':
                if (unit_string[fnd] != '}') {
                    fnd = unit_string.find_first_of(")]}", fnd + 1);
                    break;
                }
                /* FALLTHRU */
            default:
                if (unit_string[fnd - 1] == '\\') {  // ignore escape sequences
                    fnd = unit_string.find_first_of(")]}", fnd + 1);
                    break;
                }
                unit_string.insert(fnd + 1, 1, '*');
                fnd = unit_string.find_first_of(")]}", fnd + 2);
                break;
        }
    }
    // insert multiplies after ^#
    fnd = unit_string.find_first_of('^');
    while (fnd < unit_string.size() - 3 && fnd < skipMultiplyInsertionAfter) {
        if (unit_string[fnd + 1] == '-') {
            ++fnd;
        }
        if (fnd < unit_string.size() - 3) {
            std::size_t seq = 1;
            auto p = unit_string[fnd + seq];
            while (p >= '0' && p <= '9' &&
                   fnd + seq <= unit_string.size() - 1U) {
                ++seq;
                p = unit_string[fnd + seq];
            }
            if (fnd + seq > unit_string.size() - 1U) {
                break;
            }
            if (seq > 1) {
                auto c2 = unit_string[fnd + seq];
                if (c2 != '\0' && c2 != '*' && c2 != '/' && c2 != '^' &&
                    c2 != 'e' && c2 != 'E') {
                    unit_string.insert(fnd + seq, 1, '*');
                }
            }
        }
        fnd = unit_string.find_first_of('^', fnd + 2);
    }

    // this still might occur from code replacements or other removal
    if (!unit_string.empty() && unit_string.front() == '/') {
        unit_string.insert(unit_string.begin(), '1');
        changed = true;
    }
    if (!skipcodereplacement) {  // make everything inside {} lower case
        auto bloc = unit_string.find_first_of('{');
        while (bloc != std::string::npos) {
            auto ind = bloc + 1;
            if (segmentcheck(unit_string, '}', ind)) {
                std::transform(
                    unit_string.begin() + bloc + 1,
                    unit_string.begin() + ind - 1,
                    unit_string.begin() + bloc + 1,
                    ::tolower);
                bloc = unit_string.find_first_of('{', ind);
            } else {
                bloc = std::string::npos;
            }
        }
    }
    return (changed || unit_string.size() != slen);
}